

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O1

StringList * __thiscall
Args::HelpPrinter::createUsageString_abi_cxx11_
          (StringList *__return_storage_ptr__,HelpPrinter *this,ArgIface *arg,bool required)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined3 in_register_00000009;
  String usage;
  value_type local_60;
  long *local_40 [2];
  long local_30 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (CONCAT31(in_register_00000009,required) == 0) {
    std::__cxx11::string::append((char *)&local_60);
  }
  iVar2 = (*arg->_vptr_ArgIface[7])(arg);
  if (*(long *)(CONCAT44(extraout_var,iVar2) + 8) != 0) {
    std::__cxx11::string::append((char *)&local_60);
    iVar2 = (*arg->_vptr_ArgIface[7])(arg);
    std::__cxx11::string::_M_append((char *)&local_60,*(ulong *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_01,iVar2) + 8) != 0) {
      std::__cxx11::string::append((char *)&local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_60);
      local_60._M_string_length = 0;
      *local_60._M_dataplus._M_p = '\0';
    }
  }
  iVar2 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_02,iVar2) + 8) == 0) {
    iVar2 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_04,iVar2) + 8) == 0) {
      iVar2 = (*arg->_vptr_ArgIface[8])(arg);
      if (*(long *)(CONCAT44(extraout_var_05,iVar2) + 8) == 0) {
        (*arg->_vptr_ArgIface[3])(local_40,arg);
        std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40[0]);
        if (local_40[0] != local_30) {
          operator_delete(local_40[0],local_30[0] + 1);
        }
      }
    }
  }
  else {
    std::__cxx11::string::append((char *)&local_60);
    iVar2 = (*arg->_vptr_ArgIface[8])(arg);
    std::__cxx11::string::_M_append((char *)&local_60,*(ulong *)CONCAT44(extraout_var_03,iVar2));
  }
  iVar2 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::append((char *)&local_60);
    iVar2 = (*arg->_vptr_ArgIface[9])(arg);
    std::__cxx11::string::_M_append((char *)&local_60,*(ulong *)CONCAT44(extraout_var_06,iVar2));
    std::__cxx11::string::append((char *)&local_60);
  }
  if (!required) {
    std::__cxx11::string::append((char *)&local_60);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}